

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O2

int bio_write(BIO *bio,char *buf,int num_)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t __n;
  
  BIO_clear_retry_flags(bio);
  uVar7 = 0;
  if (((num_ != 0) && (buf != (char *)0x0)) && (bio->init != 0)) {
    plVar1 = (long *)bio->ptr;
    if (plVar1 == (long *)0x0) {
      __assert_fail("b != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xca,"int bio_write(BIO *, const char *, int)");
    }
    if (*plVar1 == 0) {
      __assert_fail("b->peer != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xcb,"int bio_write(BIO *, const char *, int)");
    }
    if (plVar1[5] == 0) {
      __assert_fail("b->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xcc,"int bio_write(BIO *, const char *, int)");
    }
    plVar1[6] = 0;
    if ((int)plVar1[1] == 0) {
      uVar2 = plVar1[2];
      uVar3 = plVar1[4];
      uVar4 = uVar3 - uVar2;
      if (uVar3 < uVar2) {
        __assert_fail("b->len <= b->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                      ,0xd5,"int bio_write(BIO *, const char *, int)");
      }
      if (uVar4 != 0) {
        uVar7 = (long)num_;
        if (uVar4 < (ulong)(long)num_) {
          uVar7 = uVar4;
        }
        if (uVar7 == 0) {
          __assert_fail("rest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                        ,0xe4,"int bio_write(BIO *, const char *, int)");
        }
        uVar4 = uVar7;
        do {
          if (uVar3 < uVar2 + uVar4) {
            __assert_fail("b->len + rest <= b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xea,"int bio_write(BIO *, const char *, int)");
          }
          uVar5 = uVar3;
          if (plVar1[3] + uVar2 < uVar3) {
            uVar5 = 0;
          }
          lVar6 = (plVar1[3] + uVar2) - uVar5;
          __n = uVar3 - lVar6;
          if (lVar6 + uVar4 <= uVar3) {
            __n = uVar4;
          }
          if (__n != 0) {
            memcpy((void *)(lVar6 + plVar1[5]),buf,__n);
            uVar2 = plVar1[2];
            uVar3 = plVar1[4];
          }
          uVar2 = uVar2 + __n;
          plVar1[2] = uVar2;
          if (uVar3 < uVar2) {
            __assert_fail("b->len <= b->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                          ,0xfd,"int bio_write(BIO *, const char *, int)");
          }
          buf = buf + __n;
          uVar4 = uVar4 - __n;
        } while (uVar4 != 0);
        goto LAB_003d107f;
      }
      BIO_set_retry_write(bio);
    }
    else {
      ERR_put_error(0x11,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                    ,0xd1);
    }
    uVar7 = 0xffffffffffffffff;
  }
LAB_003d107f:
  return (int)uVar7;
}

Assistant:

static int bio_write(BIO *bio, const char *buf, int num_) {
  size_t num = num_;
  size_t rest;
  struct bio_bio_st *b;

  BIO_clear_retry_flags(bio);

  if (!bio->init || buf == NULL || num == 0) {
    return 0;
  }

  b = reinterpret_cast<bio_bio_st *>(bio->ptr);
  assert(b != NULL);
  assert(b->peer != NULL);
  assert(b->buf != NULL);

  b->request = 0;
  if (b->closed) {
    // we already closed
    OPENSSL_PUT_ERROR(BIO, BIO_R_BROKEN_PIPE);
    return -1;
  }

  assert(b->len <= b->size);

  if (b->len == b->size) {
    BIO_set_retry_write(bio);  // buffer is full
    return -1;
  }

  // we can write
  if (num > b->size - b->len) {
    num = b->size - b->len;
  }

  // now write "num" bytes
  rest = num;

  assert(rest > 0);
  // one or two iterations
  do {
    size_t write_offset;
    size_t chunk;

    assert(b->len + rest <= b->size);

    write_offset = b->offset + b->len;
    if (write_offset >= b->size) {
      write_offset -= b->size;
    }
    // b->buf[write_offset] is the first byte we can write to.

    if (write_offset + rest <= b->size) {
      chunk = rest;
    } else {
      // wrap around ring buffer
      chunk = b->size - write_offset;
    }

    OPENSSL_memcpy(b->buf + write_offset, buf, chunk);

    b->len += chunk;

    assert(b->len <= b->size);

    rest -= chunk;
    buf += chunk;
  } while (rest);

  // |num| is bounded by the buffer size, which fits in |int|.
  return (int)num;
}